

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O1

void ** AllocateBuckets(uint NumBuckets)

{
  void **ppvVar1;
  
  ppvVar1 = (void **)calloc((ulong)(NumBuckets + 1),8);
  if (ppvVar1 == (void **)0x0) {
    llvm::report_bad_alloc_error("Allocation failed",true);
  }
  ppvVar1[NumBuckets] = (void *)0xffffffffffffffff;
  return ppvVar1;
}

Assistant:

static void **AllocateBuckets(unsigned NumBuckets) {
  void **Buckets = static_cast<void**>(safe_calloc(NumBuckets + 1,
                                                   sizeof(void*)));
  // Set the very last bucket to be a non-null "pointer".
  Buckets[NumBuckets] = reinterpret_cast<void*>(-1);
  return Buckets;
}